

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O0

void ht_resize(ht_hash_table *ht,int base_size)

{
  int iVar1;
  ht_item *phVar2;
  ht_item **pphVar3;
  ht_hash_table *ht_00;
  ht_item **tmp_items;
  int tmp_size;
  ht_item *item;
  int i;
  ht_hash_table *new_ht;
  int base_size_local;
  ht_hash_table *ht_local;
  
  if (0x27 < base_size) {
    ht_00 = ht_new_sized(base_size);
    for (item._4_4_ = 0; item._4_4_ < ht->size; item._4_4_ = item._4_4_ + 1) {
      phVar2 = ht->items[item._4_4_];
      if ((phVar2 != (ht_item *)0x0) && (phVar2 != &HT_DELETED_ITEM)) {
        ht_insert(ht_00,phVar2->key,phVar2->value);
      }
    }
    ht->base_size = ht_00->base_size;
    ht->count = ht_00->count;
    iVar1 = ht->size;
    ht->size = ht_00->size;
    ht_00->size = iVar1;
    pphVar3 = ht->items;
    ht->items = ht_00->items;
    ht_00->items = pphVar3;
    ht_del_hash_table(ht_00);
  }
  return;
}

Assistant:

static void ht_resize(ht_hash_table* ht, const int base_size) {
    if (base_size < HT_INITIAL_BASE_SIZE) {
        return;
    }

    ht_hash_table* new_ht = ht_new_sized(base_size);
    for (int i = 0; i < ht->size; i++) {
        ht_item* item = ht->items[i];
        if (item != nullptr && item != &HT_DELETED_ITEM) {
            ht_insert(new_ht, item->key, item->value);
        }
    }

    ht->base_size = new_ht->base_size;
    ht->count = new_ht->count;

    const int tmp_size = ht->size;
    ht->size = new_ht->size;
    new_ht->size = tmp_size;

    ht_item** tmp_items = ht->items;
    ht->items = new_ht->items;
    new_ht->items = tmp_items;
    ht_del_hash_table(new_ht);
}